

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTWaveBank_GetNumWaves(FACTWaveBank *pWaveBank,uint16_t *pnNumWaves)

{
  if (pWaveBank == (FACTWaveBank *)0x0) {
    *pnNumWaves = 0;
  }
  else {
    FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
    *pnNumWaves = (uint16_t)pWaveBank->entryCount;
    FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
  }
  return (uint)(pWaveBank == (FACTWaveBank *)0x0);
}

Assistant:

uint32_t FACTWaveBank_GetNumWaves(
	FACTWaveBank *pWaveBank,
	uint16_t *pnNumWaves
) {
	if (pWaveBank == NULL)
	{
		*pnNumWaves = 0;
		return 1;
	}
	FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
	*pnNumWaves = pWaveBank->entryCount;
	FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
	return 0;
}